

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O1

ArgInfo * __thiscall
SoapySDR::Device::getSettingInfo(ArgInfo *__return_storage_ptr__,Device *this,string *key)

{
  bool bVar1;
  long lVar2;
  __normal_iterator<const_SoapySDR::ArgInfo_*,_std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>_>
  __it;
  __normal_iterator<const_SoapySDR::ArgInfo_*,_std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>_>
  __it_00;
  __normal_iterator<const_SoapySDR::ArgInfo_*,_std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>_>
  _Var3;
  ArgInfoList allArgInfos;
  string *local_50;
  vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_> local_48;
  
  (*this->_vptr_Device[100])(&local_48);
  lVar2 = ((long)local_48.super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_48.super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 4) * -0x1111111111111111 >> 2;
  __it_00._M_current =
       local_48.super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_50 = key;
  if (0 < lVar2) {
    __it_00._M_current =
         local_48.super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>._M_impl.
         super__Vector_impl_data._M_start + lVar2 * 4;
    lVar2 = lVar2 + 1;
    __it._M_current =
         local_48.super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>._M_impl.
         super__Vector_impl_data._M_start;
    do {
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<SoapySDR::Device::getSettingInfo(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<SoapySDR::Device::getSettingInfo(std::__cxx11::string_const&)const::__0>
                          *)&local_50,__it);
      _Var3._M_current = __it._M_current;
      if (bVar1) goto LAB_0011ca9a;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<SoapySDR::Device::getSettingInfo(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<SoapySDR::Device::getSettingInfo(std::__cxx11::string_const&)const::__0>
                          *)&local_50,__it._M_current + 1);
      _Var3._M_current = __it._M_current + 1;
      if (bVar1) goto LAB_0011ca9a;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<SoapySDR::Device::getSettingInfo(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<SoapySDR::Device::getSettingInfo(std::__cxx11::string_const&)const::__0>
                          *)&local_50,__it._M_current + 2);
      _Var3._M_current = __it._M_current + 2;
      if (bVar1) goto LAB_0011ca9a;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<SoapySDR::Device::getSettingInfo(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<SoapySDR::Device::getSettingInfo(std::__cxx11::string_const&)const::__0>
                          *)&local_50,__it._M_current + 3);
      _Var3._M_current = __it._M_current + 3;
      if (bVar1) goto LAB_0011ca9a;
      __it._M_current = __it._M_current + 4;
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
  }
  lVar2 = ((long)local_48.super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)__it_00._M_current >> 4) *
          -0x1111111111111111;
  if (lVar2 != 1) {
    if (lVar2 != 2) {
      _Var3._M_current =
           local_48.super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if ((lVar2 != 3) ||
         (bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<SoapySDR::Device::getSettingInfo(std::__cxx11::string_const&)const::$_0>
                  ::operator()((_Iter_pred<SoapySDR::Device::getSettingInfo(std::__cxx11::string_const&)const::__0>
                                *)&local_50,__it_00), _Var3._M_current = __it_00._M_current, bVar1))
      goto LAB_0011ca9a;
      __it_00._M_current = __it_00._M_current + 1;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<SoapySDR::Device::getSettingInfo(std::__cxx11::string_const&)const::$_0>::
            operator()((_Iter_pred<SoapySDR::Device::getSettingInfo(std::__cxx11::string_const&)const::__0>
                        *)&local_50,__it_00);
    _Var3._M_current = __it_00._M_current;
    if (bVar1) goto LAB_0011ca9a;
    __it_00._M_current = __it_00._M_current + 1;
  }
  bVar1 = __gnu_cxx::__ops::
          _Iter_pred<SoapySDR::Device::getSettingInfo(std::__cxx11::string_const&)const::$_0>::
          operator()((_Iter_pred<SoapySDR::Device::getSettingInfo(std::__cxx11::string_const&)const::__0>
                      *)&local_50,__it_00);
  _Var3._M_current = __it_00._M_current;
  if (!bVar1) {
    _Var3._M_current =
         local_48.super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
LAB_0011ca9a:
  if (_Var3._M_current ==
      local_48.super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ArgInfo::ArgInfo(__return_storage_ptr__);
  }
  else {
    ArgInfo::ArgInfo(__return_storage_ptr__,_Var3._M_current);
  }
  std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

SoapySDR::ArgInfo SoapySDR::Device::getSettingInfo(const std::string &key) const
{
    const auto allArgInfos = this->getSettingInfo();
    auto argInfoIter = std::find_if(
        allArgInfos.begin(),
        allArgInfos.end(),
        [&key](const SoapySDR::ArgInfo &argInfo)
        {
            return (argInfo.key == key);
        });

    return (argInfoIter != allArgInfos.end()) ? (*argInfoIter) : SoapySDR::ArgInfo();
}